

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeParseCellPtrIndex(MemPage *pPage,u8 *pCell,CellInfo *pInfo)

{
  byte *pbVar1;
  CellInfo *in_RDX;
  byte *pbVar2;
  u8 *in_RSI;
  MemPage *in_RDI;
  u8 *pEnd;
  u32 nPayload;
  u8 *pIter;
  bool local_31;
  uint local_24;
  byte *local_20;
  
  pbVar1 = in_RSI + (int)(uint)in_RDI->childPtrSize;
  local_24 = (uint)*pbVar1;
  local_20 = pbVar1;
  if (0x7f < local_24) {
    local_24 = local_24 & 0x7f;
    do {
      pbVar2 = local_20 + 1;
      local_24 = local_24 << 7 | local_20[1] & 0x7f;
      local_31 = 0x7f < *pbVar2 && pbVar2 < pbVar1 + 8;
      local_20 = pbVar2;
    } while (local_31);
  }
  in_RDX->nKey = (ulong)local_24;
  in_RDX->nPayload = local_24;
  in_RDX->pPayload = local_20 + 1;
  if (in_RDI->maxLocal < local_24) {
    btreeParseCellAdjustSizeForOverflow(in_RDI,in_RSI,in_RDX);
  }
  else {
    in_RDX->nSize = (u16)local_24 + ((short)(local_20 + 1) - (short)in_RSI);
    if (in_RDX->nSize < 4) {
      in_RDX->nSize = 4;
    }
    in_RDX->nLocal = (u16)local_24;
  }
  return;
}

Assistant:

static void btreeParseCellPtrIndex(
  MemPage *pPage,         /* Page containing the cell */
  u8 *pCell,              /* Pointer to the cell text. */
  CellInfo *pInfo         /* Fill in this structure */
){
  u8 *pIter;              /* For scanning through pCell */
  u32 nPayload;           /* Number of bytes of cell payload */

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->leaf==0 || pPage->leaf==1 );
  assert( pPage->intKeyLeaf==0 );
  pIter = pCell + pPage->childPtrSize;
  nPayload = *pIter;
  if( nPayload>=0x80 ){
    u8 *pEnd = &pIter[8];
    nPayload &= 0x7f;
    do{
      nPayload = (nPayload<<7) | (*++pIter & 0x7f);
    }while( *(pIter)>=0x80 && pIter<pEnd );
  }
  pIter++;
  pInfo->nKey = nPayload;
  pInfo->nPayload = nPayload;
  pInfo->pPayload = pIter;
  testcase( nPayload==pPage->maxLocal );
  testcase( nPayload==(u32)pPage->maxLocal+1 );
  if( nPayload<=pPage->maxLocal ){
    /* This is the (easy) common case where the entire payload fits
    ** on the local page.  No overflow is required.
    */
    pInfo->nSize = nPayload + (u16)(pIter - pCell);
    if( pInfo->nSize<4 ) pInfo->nSize = 4;
    pInfo->nLocal = (u16)nPayload;
  }else{
    btreeParseCellAdjustSizeForOverflow(pPage, pCell, pInfo);
  }
}